

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O2

int XMLSearch_search_set_text(XMLSearch *search,SXML_CHAR *text)

{
  char *pcVar1;
  uint uVar2;
  
  if (search == (XMLSearch *)0x0) {
    uVar2 = 0;
  }
  else if (text == (SXML_CHAR *)0x0) {
    uVar2 = 1;
    if (search->text != (SXML_CHAR *)0x0) {
      free(search->text);
      search->text = (SXML_CHAR *)0x0;
    }
  }
  else {
    pcVar1 = strdup(text);
    search->text = pcVar1;
    uVar2 = (uint)(pcVar1 != (char *)0x0);
  }
  return uVar2;
}

Assistant:

int XMLSearch_search_set_text(XMLSearch* search, const SXML_CHAR* text)
{
	if (search == NULL)
		return FALSE;

	if (text == NULL) {
		if (search->text != NULL) {
			__free(search->text);
			search->text = NULL;
		}
		return TRUE;
	}

	search->text = sx_strdup(text);
	return (search->text != NULL);
}